

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::absolute_pose::modules::p3p_gao_main
               (bearingVectors_t *f,points_t *points,transformations_t *solutions)

{
  pointer *ppMVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer pMVar5;
  iterator __position;
  double dVar6;
  double dVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  undefined1 auVar59 [16];
  double dVar60;
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  points_t p_cam;
  transformation_t solution;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  vector<double,_std::allocator<double>_> x_temp;
  Matrix<double,_4,_1,_0,_4,_1> Y;
  Matrix<double,_4,_1,_0,_4,_1> X;
  Matrix<double,_4,_1,_0,_4,_1> Z;
  long local_360;
  iterator iStack_358;
  Matrix<double,_3,_1,_0,_3,_1> *local_350;
  undefined1 local_340 [48];
  undefined1 local_310 [16];
  transformation_t local_300;
  undefined1 local_2a0 [16];
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  ulong local_268;
  undefined1 local_260 [32];
  undefined1 local_230 [16];
  double local_220 [4];
  undefined8 local_200;
  vector<double,_std::allocator<double>_> local_1f8;
  undefined1 local_1e0 [16];
  double dStack_1d0;
  double dStack_1c8;
  undefined1 local_1c0 [16];
  double dStack_1b0;
  double dStack_1a8;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  double local_150;
  double dStack_148;
  undefined1 local_140 [16];
  double local_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double local_110;
  double dStack_108;
  double local_100 [4];
  double local_e0 [4];
  undefined1 local_c0 [4] [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pMVar5 = (points->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  auVar15 = *(undefined1 (*) [16])
             &(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data;
  dVar52 = *(double *)
            ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data + 0x10);
  auVar20 = *(undefined1 (*) [16])
             &pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
  dVar41 = *(double *)
            ((long)&pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
  auVar18 = *(undefined1 (*) [16])
             &pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data;
  auVar16 = vsubpd_avx(auVar15,auVar20);
  dVar46 = *(double *)
            ((long)&pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
  dVar54 = dVar52 - dVar41;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar54 * dVar54 + auVar16._0_8_ * auVar16._0_8_ + auVar16._8_8_ * auVar16._8_8_;
  local_230 = vsqrtpd_avx(auVar14);
  auVar15 = vsubpd_avx(auVar15,auVar18);
  dVar52 = dVar52 - dVar46;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar52 * dVar52 + auVar15._0_8_ * auVar15._0_8_ + auVar15._8_8_ * auVar15._8_8_;
  auVar15 = vsqrtpd_avx(auVar16);
  pMVar5 = (f->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_110 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
  dStack_108 = *(double *)
                ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + 8);
  local_130 = pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
  dStack_128 = *(double *)
                ((long)&pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + 8);
  local_120 = *(double *)
               ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + 0x10);
  dVar52 = *(double *)
            ((long)&pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
  local_140._8_8_ = 0;
  local_140._0_8_ = dVar52;
  local_150 = pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
  dStack_148 = *(double *)
                ((long)&pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + 8);
  dVar54 = *(double *)
            ((long)&pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
  local_160._8_8_ = 0;
  local_160._0_8_ = dVar54;
  auVar15 = vdivpd_avx(auVar15,local_230);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_130 * local_150 + dStack_128 * dStack_148 + dVar52 * dVar54;
  auVar13 = vaddsd_avx512f(auVar13,auVar13);
  auVar14 = vmulsd_avx512f(auVar13,auVar13);
  auVar16 = vunpcklpd_avx(local_160,local_140);
  dVar52 = local_120 * auVar16._0_8_ + local_150 * local_110 + dStack_148 * dStack_108;
  dVar54 = local_120 * auVar16._8_8_ + local_130 * local_110 + dStack_128 * dStack_108;
  auVar23._0_8_ = dVar52 + dVar52;
  auVar23._8_8_ = dVar54 + dVar54;
  local_1c0._0_8_ = auVar15._0_8_ * auVar15._0_8_;
  local_1c0._8_8_ = auVar23._8_8_ * auVar23._8_8_;
  auVar15 = vmulsd_avx512f(auVar23,auVar23);
  auVar16 = vaddsd_avx512f(auVar14,auVar15);
  local_170 = vshufpd_avx512vl(local_1c0,local_1c0,1);
  auVar16 = vaddsd_avx512f(local_170,auVar16);
  local_2a0 = vmulsd_avx512f(auVar13,auVar23);
  auVar17 = vshufpd_avx512vl(auVar23,auVar23,1);
  auVar16 = vfnmadd231sd_avx512f(auVar16,local_2a0,auVar17);
  dVar52 = auVar16._0_8_ + -1.0;
  if ((dVar52 != 0.0) || (NAN(dVar52))) {
    local_260 = ZEXT1632(auVar23);
    auVar20 = vsubpd_avx(auVar20,auVar18);
    dVar41 = dVar41 - dVar46;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar41 * dVar41 + auVar20._0_8_ * auVar20._0_8_ + auVar20._8_8_ * auVar20._8_8_;
    auVar20 = vsqrtpd_avx(auVar18);
    auVar20 = vdivpd_avx(auVar20,local_230);
    auVar24._0_8_ = auVar20._0_8_ * auVar20._0_8_;
    auVar24._8_8_ = auVar20._8_8_ * auVar20._8_8_;
    local_278 = auVar24._0_8_ * auVar24._0_8_;
    dVar52 = (double)local_1c0._0_8_ * (double)local_1c0._0_8_;
    auVar16 = ZEXT816(0xc000000000000000);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar52;
    auVar20 = vfmadd213sd_fma(auVar16,local_1c0,auVar22);
    auVar18 = vmulsd_avx512f(local_1c0,local_170);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_278 + auVar20._0_8_ + 1.0;
    auVar20 = vfnmadd231sd_fma(auVar19,auVar18,auVar24);
    local_290 = (double)local_1c0._0_8_ + (double)local_1c0._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_290;
    auVar20 = vfmadd231sd_fma(auVar20,auVar21,auVar24);
    auVar20 = vfmadd231sd_fma(auVar20,auVar24,auVar16);
    local_220[0] = auVar20._0_8_;
    if ((local_220[0] != 0.0) || (NAN(local_220[0]))) {
      auVar20._8_8_ = 0x8000000000000000;
      auVar20._0_8_ = 0x8000000000000000;
      auVar19 = vxorpd_avx512vl(local_2a0,auVar20);
      auVar25._8_8_ = 0x8000000000000000;
      auVar25._0_8_ = 0x8000000000000000;
      local_190 = vxorpd_avx512vl(auVar18,auVar25);
      local_280 = local_278 + local_278;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = (double)local_1c0._0_8_ * -2.0 * auVar23._0_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_280 * auVar23._0_8_;
      auVar20 = vfmsub231sd_fma(auVar50,auVar24,auVar48);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = auVar23._0_8_ * auVar18._0_8_;
      auVar20 = vfmadd213sd_fma(auVar28,auVar24,auVar20);
      auVar20 = vfmadd231sd_fma(auVar20,auVar23,auVar16);
      auVar20 = vfmadd231sd_fma(auVar20,auVar21,auVar23);
      local_288 = auVar24._0_8_ * 4.0;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = local_288;
      auVar20 = vfmadd231sd_fma(auVar20,auVar71,auVar23);
      auVar18 = vmulsd_avx512f(local_1c0,auVar13);
      auVar20 = vfmadd231sd_avx512f(auVar20,auVar18,auVar17);
      auVar21 = vmulsd_avx512f(local_1c0,auVar17);
      auVar21 = vmulsd_avx512f(auVar13,auVar21);
      auVar20 = vfmadd231sd_fma(auVar20,auVar21,auVar24);
      auVar26._8_8_ = 0x8000000000000000;
      auVar26._0_8_ = 0x8000000000000000;
      auVar22 = vxorpd_avx512vl(auVar22,auVar26);
      auVar22 = vmulsd_avx512f(auVar17,auVar22);
      auVar20 = vfmadd231sd_avx512f(auVar20,auVar22,auVar13);
      local_220[1] = auVar20._0_8_;
      local_180._8_8_ = 0;
      local_180._0_8_ = dVar52;
      auVar20 = vfmadd213sd_avx512f(local_170,local_180,auVar15);
      auVar20 = vfnmadd231sd_avx512f(auVar20,local_1c0,auVar14);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = (double)local_1c0._0_8_ * auVar19._0_8_;
      auVar20 = vfmadd213sd_avx512f(auVar29,auVar17,auVar20);
      auVar20 = vfmadd231sd_avx512f(auVar20,local_180,auVar14);
      auVar20 = vfmadd231sd_fma(auVar20,local_190,auVar24);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = auVar20._0_8_ + 2.0;
      auVar20 = vfmadd231sd_fma(auVar30,local_180,auVar16);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = (double)local_1c0._0_8_ * auVar24._0_8_;
      auVar19 = vmulsd_avx512f(auVar56,auVar17);
      auVar19 = vmulsd_avx512f(auVar13,auVar19);
      auVar20 = vfnmadd213sd_fma(auVar19,auVar23,auVar20);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_278;
      auVar20 = vfmadd231sd_fma(auVar20,auVar67,ZEXT816(0x4000000000000000));
      auVar20 = vfmadd231sd_fma(auVar20,auVar24,ZEXT816(0xc010000000000000));
      auVar19 = vmulsd_avx512f(auVar15,auVar16);
      auVar20 = vfmadd213sd_fma(auVar19,auVar24,auVar20);
      vmovsd_avx512f(auVar15);
      auVar15 = vfmadd231sd_avx512f(auVar20,auVar15,auVar67);
      local_220[2] = auVar15._0_8_;
      vmovsd_avx512f(auVar13);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = auVar24._0_8_ * auVar21._0_8_;
      auVar15 = vfmadd231sd_avx512f(auVar15,auVar13,auVar22);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_280;
      auVar15 = vfnmadd231sd_fma(auVar15,auVar68,auVar23);
      auVar20 = vmulsd_avx512f(auVar14,auVar23);
      auVar15 = vfmadd213sd_fma(auVar20,local_1c0,auVar15);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_290 * auVar23._0_8_;
      auVar15 = vfmadd213sd_fma(auVar31,auVar24,auVar15);
      auVar15 = vfmadd231sd_fma(auVar15,auVar71,auVar23);
      local_1e0 = auVar17;
      auVar15 = vfmadd231sd_avx512f(auVar15,auVar17,auVar18);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_290;
      auVar15 = vfnmadd231sd_fma(auVar15,auVar73,auVar23);
      auVar15 = vfmadd231sd_fma(auVar15,auVar23,auVar16);
      local_220[3] = auVar15._0_8_;
      auVar15 = vfmadd213sd_fma(auVar16,auVar24,ZEXT816(0x3ff0000000000000));
      auVar15 = vfmadd231sd_fma(auVar15,local_1c0,ZEXT816(0x4000000000000000));
      vmovsd_avx512f(auVar14);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar52 + auVar15._0_8_;
      auVar15 = vfnmadd231sd_avx512f(auVar17,local_1c0,auVar14);
      local_340._0_16_ = auVar24;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_278 + auVar15._0_8_;
      auVar15 = vfnmadd231sd_fma(auVar27,auVar73,auVar24);
      local_200 = auVar15._0_8_;
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [0] = 0.0;
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [2] = 0.0;
      dStack_118 = local_120;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_300,5,5,1);
      if ((local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1] != 2.47032822920623e-323) ||
         (local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
          array[2] != 4.94065645841247e-324)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&local_300,5,5,1);
      }
      dVar52 = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[0];
      uVar12 = (long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[1] *
               (long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[2];
      uVar10 = uVar12 + 7;
      if (-1 < (long)uVar12) {
        uVar10 = uVar12;
      }
      uVar9 = uVar10 & 0xfffffffffffffff8;
      if (7 < (long)uVar12) {
        uVar8 = 8;
        if (8 < (long)uVar9) {
          uVar8 = uVar9;
        }
        memcpy((void *)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                       m_storage.m_data.array[0],local_220,uVar8 * 8);
      }
      if ((long)uVar9 < (long)uVar12) {
        lVar11 = (long)uVar10 >> 3;
        memcpy((double *)((long)dVar52 + lVar11 * 8 * 8),local_220 + lVar11 * 8,
               uVar12 * 8 + lVar11 * -0x40);
      }
      math::o4_roots(&local_1f8,(MatrixXd *)&local_300);
      if ((double *)
          local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
          array[0] != (double *)0x0) {
        free(*(void **)((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>
                              .m_storage.m_data.array[0] + -8));
      }
      auVar15 = vaddsd_avx512f(local_340._0_16_,ZEXT816(0xbff0000000000000));
      auVar34._0_8_ = auVar15._0_8_;
      auVar15 = vaddsd_avx512f(local_1c0,auVar15);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_2a0._0_8_;
      auVar20 = vmulsd_avx512f(local_1e0,auVar2);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = local_268;
      auVar15 = vfmadd231sd_avx512f(auVar20,auVar82,auVar15);
      auVar48 = local_260._0_16_;
      auVar20 = vmulsd_avx512f(local_340._0_16_,auVar48);
      auVar20 = vmulsd_avx512f(local_1e0,auVar20);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_270;
      auVar16 = vfnmadd213sd_fma(auVar20,auVar33,auVar15);
      auVar18 = vmulpd_avx512vl(auVar48,local_1c0);
      auVar15 = vshufpd_avx(auVar18,auVar18,1);
      dVar46 = auVar15._0_8_;
      dVar41 = dVar46 * local_290;
      local_2a0._0_8_ = dVar41;
      auVar13 = vaddsd_avx512f(local_340._0_16_,local_340._0_16_);
      auVar14 = vaddsd_avx512f(auVar15,auVar15);
      auVar69._8_8_ = 0x8000000000000000;
      auVar69._0_8_ = 0x8000000000000000;
      auVar17 = vxorpd_avx512vl(auVar14,auVar69);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_278;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_278 * local_270;
      auVar23 = vmulsd_avx512f(auVar59,local_170);
      auVar20 = vfmadd213sd_fma(local_170,auVar33,auVar23);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = dVar41;
      auVar19 = vmulsd_avx512f(auVar48,auVar51);
      auVar20 = vfnmadd231sd_avx512f(auVar20,auVar19,local_340._0_16_);
      auVar24 = vmulsd_avx512f(local_1c0,auVar14);
      auVar20 = vfmadd231sd_avx512f(auVar20,auVar24,auVar48);
      auVar20 = vfnmadd231sd_avx512f(auVar20,auVar14,auVar48);
      dVar52 = local_270 + local_270;
      auVar22 = vaddsd_avx512f(local_340._0_16_,local_1c0);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = auVar22._0_8_ * dVar52;
      auVar20 = vfnmadd213sd_avx512f(auVar76,local_170,auVar20);
      auVar22 = vmulsd_avx512f(local_170,local_170);
      local_270 = auVar22._0_8_ * local_270;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_270;
      auVar20 = vfmadd231sd_avx512f(auVar20,auVar63,local_1c0);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_288;
      auVar21 = vmulsd_avx512f(auVar78,auVar15);
      auVar20 = vfmadd231sd_avx512f(auVar20,auVar21,auVar48);
      auVar18 = vmulsd_avx512f(local_340._0_16_,auVar18);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = auVar18._0_8_ * dVar46;
      auVar20 = vfmadd213sd_avx512f(auVar57,local_170,auVar20);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = auVar17._0_8_ * local_278;
      auVar20 = vfmadd231sd_avx512f(auVar20,auVar74,auVar48);
      auVar18 = vaddsd_avx512f(local_170,local_170);
      auVar18 = vmulsd_avx512f(auVar33,auVar18);
      auVar17 = vmulsd_avx512f(local_1c0,auVar18);
      auVar20 = vfmadd213sd_avx512f(auVar17,local_340._0_16_,auVar20);
      auVar17 = vmulsd_avx512f(local_180,local_170);
      auVar20 = vfmadd213sd_fma(auVar17,auVar33,auVar20);
      auVar17 = vmulsd_avx512f(local_170,auVar15);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = auVar17._0_8_ * local_180._0_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_310._0_8_;
      auVar17 = vfmadd231sd_avx512f(auVar77,auVar15,auVar80);
      auVar25 = vmulsd_avx512f(auVar82,local_1e0);
      auVar17 = vfmadd231sd_avx512f(auVar17,auVar25,local_180);
      auVar17 = vfnmadd231sd_avx512f(auVar17,auVar15,auVar78);
      auVar26 = vmulsd_avx512f(auVar15,auVar13);
      auVar17 = vfnmadd213sd_avx512f(auVar26,auVar80,auVar17);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_310._0_8_;
      auVar26 = vmulsd_avx512f(auVar81,auVar15);
      auVar17 = vfmadd213sd_avx512f(auVar26,auVar47,auVar17);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_280;
      auVar17 = vfmadd213sd_avx512f(auVar79,auVar15,auVar17);
      auVar26 = vmulsd_avx512f(local_180,ZEXT816(0xc000000000000000));
      auVar17 = vfmadd231sd_avx512f(auVar17,auVar26,auVar15);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_268;
      auVar27 = vaddsd_avx512f(auVar83,auVar83);
      auVar70._0_8_ = -auVar27._0_8_;
      auVar70._8_8_ = auVar27._8_8_ ^ 0x8000000000000000;
      auVar28 = vmulsd_avx512f(local_1c0,auVar70);
      auVar17 = vfmadd231sd_avx512f(auVar17,auVar28,local_1e0);
      auVar29 = vmulsd_avx512f(auVar33,ZEXT816(0x4010000000000000));
      auVar29 = vmulsd_avx512f(local_340._0_16_,auVar29);
      auVar30 = vmulsd_avx512f(auVar29,local_170);
      auVar17 = vfmadd213sd_avx512f(auVar30,auVar48,auVar17);
      auVar30 = vmulsd_avx512f(auVar13,auVar83);
      auVar30 = vmulsd_avx512f(auVar30,local_1e0);
      auVar17 = vfmadd213sd_avx512f(auVar30,local_1c0,auVar17);
      auVar30 = vmulsd_avx512f(local_170,auVar13);
      auVar30 = vmulsd_avx512f(auVar48,auVar30);
      auVar30 = vmulsd_avx512f(local_1c0,auVar30);
      auVar17 = vfnmadd213sd_avx512f(auVar30,auVar33,auVar17);
      auVar30 = vmulsd_avx512f(local_340._0_16_,auVar27);
      auVar17 = vfnmadd213sd_avx512f(auVar30,local_1e0,auVar17);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_190._0_8_;
      auVar30 = vmulsd_avx512f(auVar15,auVar3);
      auVar17 = vfmadd231sd_avx512f(auVar17,local_1e0,auVar83);
      auVar17 = vfmadd231sd_avx512f(auVar17,local_340._0_16_,auVar30);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = dVar52;
      auVar31 = vmulsd_avx512f(auVar65,local_170);
      auVar31 = vmulsd_avx512f(local_1c0,auVar31);
      auVar17 = vfmadd213sd_avx512f(auVar31,auVar48,auVar17);
      auVar17 = vfmadd231sd_avx512f(auVar17,auVar47,auVar25);
      auVar25 = vmulsd_avx512f(auVar48,auVar65);
      auVar17 = vfnmadd213sd_avx512f(auVar25,local_170,auVar17);
      auVar17 = vfmadd231sd_avx512f(auVar17,auVar15,ZEXT816(0x4000000000000000));
      auVar18 = vmulsd_avx512f(auVar47,auVar18);
      auVar18 = vfnmadd213sd_avx512f(auVar18,auVar48,auVar17);
      auVar17 = vmulsd_avx512f(auVar48,auVar22);
      auVar17 = vmulsd_avx512f(local_1c0,auVar17);
      auVar17 = vfnmadd213sd_avx512f(auVar17,auVar33,auVar18);
      auVar18 = vmulsd_avx512f(auVar33,local_170);
      auVar18 = vmulsd_avx512f(auVar81,auVar18);
      auVar18 = vfmadd231sd_avx512f(auVar18,auVar48,auVar21);
      auVar22 = vmulsd_avx512f(auVar33,auVar27);
      auVar21 = vmulsd_avx512f(local_1c0,auVar22);
      auVar18 = vfmadd213sd_avx512f(auVar21,local_340._0_16_,auVar18);
      auVar18 = vfnmadd231sd_avx512f(auVar18,local_170,auVar29);
      auVar18 = vfnmadd231sd_avx512f(auVar18,auVar48,auVar24);
      auVar24 = vmulsd_avx512f(auVar48,auVar27);
      auVar18 = vfnmadd213sd_avx512f(auVar24,local_1e0,auVar18);
      auVar24 = vmulsd_avx512f(auVar26,local_170);
      auVar18 = vfmadd213sd_avx512f(auVar24,auVar33,auVar18);
      auVar18 = vfmadd231sd_avx512f(auVar18,local_1c0,auVar63);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = dVar52 * local_278;
      auVar18 = vfmadd213sd_avx512f(auVar72,local_170,auVar18);
      auVar18 = vfmadd231sd_avx512f(auVar18,auVar48,auVar74);
      auVar18 = vfnmadd231sd_avx512f(auVar18,auVar22,local_340._0_16_);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_268;
      auVar24 = vmulsd_avx512f(auVar33,auVar84);
      auVar18 = vfmadd231sd_fma(auVar18,auVar24,auVar47);
      auVar18 = vfmadd231sd_avx512f(auVar18,auVar65,local_170);
      auVar18 = vfmadd231sd_avx512f(auVar18,auVar84,auVar33);
      auVar18 = vfmadd231sd_avx512f(auVar18,local_340._0_16_,auVar19);
      auVar19 = vaddsd_avx512f(auVar48,auVar48);
      auVar19 = vmulsd_avx512f(auVar84,auVar19);
      auVar19 = vmulsd_avx512f(local_1c0,auVar19);
      auVar18 = vfmadd213sd_avx512f(auVar19,local_1e0,auVar18);
      auVar19 = vmulsd_avx512f(auVar48,ZEXT816(0x4010000000000000));
      auVar19 = vmulsd_avx512f(local_340._0_16_,auVar19);
      auVar19 = vmulsd_avx512f(local_1e0,auVar19);
      auVar18 = vfmadd213sd_avx512f(auVar19,auVar84,auVar18);
      auVar34._8_8_ = 0;
      auVar19 = vsubsd_avx512f(auVar34,local_1c0);
      auVar16 = vfmadd213sd_avx512f(auVar19,local_170,auVar16);
      auVar19 = vmulsd_avx512f(local_340._0_16_,auVar65);
      auVar19 = vmulsd_avx512f(auVar19,local_170);
      auVar18 = vfnmadd213sd_avx512f(auVar19,auVar81,auVar18);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = auVar27._0_8_ * local_278;
      auVar19 = vmulsd_avx512f(auVar66,local_1e0);
      auVar18 = vfnmadd213sd_avx512f(auVar19,auVar48,auVar18);
      auVar23 = vfmadd231sd_avx512f(auVar18,auVar23,auVar81);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar41;
      auVar18 = vmulsd_avx512f(local_340._0_16_,auVar4);
      auVar18 = vfmadd231sd_fma(auVar18,auVar47,auVar15);
      auVar18 = vfmadd231sd_avx512f(auVar18,auVar30,local_340._0_16_);
      auVar18 = vfnmadd231sd_fma(auVar18,auVar13,auVar15);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar46 + auVar18._0_8_;
      auVar15 = vfmadd231sd_fma(auVar42,local_180,auVar15);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_270;
      auVar18 = vfnmadd231sd_fma(auVar20,auVar64,local_180);
      auVar20 = vfnmadd231sd_avx512f(auVar23,auVar48,auVar14);
      auVar20 = vfnmadd231sd_avx512f(auVar20,local_1c0,auVar22);
      auVar20 = vfmadd231sd_fma(auVar20,auVar24,local_180);
      auVar13 = vmulsd_avx512f(local_1c0,auVar16);
      dVar52 = auVar16._0_8_ * auVar13._0_8_;
      auVar16 = vmulsd_avx512f(auVar28,local_1e0);
      auVar13 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),local_340._0_16_);
      auVar16 = vmulsd_avx512f(auVar48,auVar16);
      auVar20 = vfmadd213sd_avx512f(auVar16,local_340._0_16_,auVar20);
      auVar16 = vfmsub231sd_avx512f(auVar48,local_340._0_16_,auVar48);
      dVar6 = *(double *)
               (undefined1 *)
               local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar7 = *(double *)
               ((undefined1 *)
                local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + 8);
      dStack_1b0 = *(double *)
                    *(undefined1 (*) [16])
                     ((long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x10);
      dStack_1a8 = *(double *)
                    (*(undefined1 (*) [16])
                      ((long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + 0x10) + 8);
      auVar15 = vfnmadd231sd_avx512f(auVar15,auVar14,local_1c0);
      auVar14 = vsubsd_avx512f(auVar13,local_1c0);
      auVar13 = vaddsd_avx512f(local_1c0,auVar13);
      dVar58 = dVar6 * dVar6;
      dVar60 = dVar7 * dVar7;
      dVar61 = dStack_1b0 * dStack_1b0;
      dVar62 = dStack_1a8 * dStack_1a8;
      dVar46 = auVar14._0_8_;
      dVar53 = auVar16._0_8_;
      dVar49 = auVar13._0_8_;
      dVar41 = auVar15._0_8_;
      dVar55 = auVar18._0_8_;
      dVar75 = auVar17._0_8_;
      dVar54 = auVar20._0_8_;
      auVar43._0_8_ =
           (dVar46 * dVar58 + dVar6 * dVar53 + dVar49) *
           (dVar55 * dVar58 + dVar41 * dVar6 * dVar58 + dVar6 * dVar75 + dVar54);
      auVar43._8_8_ =
           (dVar46 * dVar60 + dVar7 * dVar53 + dVar49) *
           (dVar55 * dVar60 + dVar41 * dVar7 * dVar60 + dVar7 * dVar75 + dVar54);
      auVar43._16_8_ =
           (dVar46 * dVar61 + dStack_1b0 * dVar53 + dVar49) *
           (dVar55 * dVar61 + dVar41 * dStack_1b0 * dVar61 + dStack_1b0 * dVar75 + dVar54);
      auVar43._24_8_ =
           (dVar46 * dVar62 + dStack_1a8 * dVar53 + dVar49) *
           (dVar55 * dVar62 + dVar41 * dStack_1a8 * dVar62 + dStack_1a8 * dVar75 + dVar54);
      auVar32._8_8_ = dVar52;
      auVar32._0_8_ = dVar52;
      auVar32._16_8_ = dVar52;
      auVar32._24_8_ = dVar52;
      _local_1e0 = vdivpd_avx(auVar43,auVar32);
      dVar52 = local_1e0._0_8_;
      dVar41 = local_1e0._8_8_;
      dVar46 = local_1e0._16_8_;
      dVar54 = local_1e0._24_8_;
      auVar35._0_8_ = dVar58 + dVar52 * dVar52;
      auVar35._8_8_ = dVar60 + dVar41 * dVar41;
      auVar35._16_8_ = dVar61 + dVar46 * dVar46;
      auVar35._24_8_ = dVar62 + dVar54 * dVar54;
      auVar32 = vpermpd_avx512vl(local_260,0x55);
      auVar44._0_8_ = auVar32._0_8_ * dVar6 * dVar52;
      auVar44._8_8_ = auVar32._8_8_ * dVar7 * dVar41;
      auVar44._16_8_ = auVar32._16_8_ * dStack_1b0 * dVar46;
      auVar44._24_8_ = auVar32._24_8_ * dStack_1a8 * dVar54;
      local_340._0_32_ = vsubpd_avx(auVar35,auVar44);
      local_1c0 = *(undefined1 (*) [16])
                   local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if (local_340._0_8_ < 0.0) {
        auVar37._0_8_ = sqrt(local_340._0_8_);
        auVar37._8_56_ = extraout_var;
        local_260._0_16_ = auVar37._0_16_;
      }
      else {
        local_260._0_16_ = vsqrtsd_avx(local_340._0_16_,local_340._0_16_);
      }
      auVar15 = vshufpd_avx(local_340._0_16_,local_340._0_16_,1);
      if (auVar15._0_8_ < 0.0) {
        auVar38._0_8_ = sqrt(auVar15._0_8_);
        auVar38._8_56_ = extraout_var_00;
        local_310 = auVar38._0_16_;
        auVar15 = local_340._16_16_;
      }
      else {
        local_310 = vsqrtsd_avx(auVar15,auVar15);
        auVar15 = local_340._16_16_;
      }
      if (auVar15._0_8_ < 0.0) {
        local_340._0_16_ = auVar15;
        auVar39._0_8_ = sqrt(auVar15._0_8_);
        auVar39._8_56_ = extraout_var_01;
        auVar20 = auVar39._0_16_;
        auVar15 = local_340._0_16_;
      }
      else {
        auVar20 = vsqrtsd_avx(auVar15,auVar15);
      }
      auVar15 = vshufpd_avx(auVar15,auVar15,1);
      if (auVar15._0_8_ < 0.0) {
        local_340._0_16_ = auVar20;
        auVar40._0_8_ = sqrt(auVar15._0_8_);
        auVar40._8_56_ = extraout_var_02;
        auVar15 = auVar40._0_16_;
        auVar20 = local_340._0_16_;
      }
      else {
        auVar15 = vsqrtsd_avx(auVar15,auVar15);
      }
      auVar15 = vunpcklpd_avx(auVar20,auVar15);
      auVar45._8_8_ = local_230._0_8_;
      auVar45._0_8_ = local_230._0_8_;
      auVar45._16_8_ = local_230._0_8_;
      auVar45._24_8_ = local_230._0_8_;
      auVar20 = vunpcklpd_avx(local_260._0_16_,local_310);
      auVar36._16_16_ = auVar15;
      auVar36._0_16_ = auVar20;
      local_c0[0] = vdivpd_avx(auVar45,auVar36);
      local_e0[0] = local_c0[0]._0_8_ * (double)local_1c0._0_8_;
      local_e0[1] = local_c0[0]._8_8_ * (double)local_1c0._8_8_;
      local_e0[2] = local_c0[0]._16_8_ * dStack_1b0;
      local_e0[3] = local_c0[0]._24_8_ * dStack_1a8;
      local_100[0] = local_c0[0]._0_8_ * (double)local_1e0._0_8_;
      local_100[1] = local_c0[0]._8_8_ * (double)local_1e0._8_8_;
      local_100[2] = local_c0[0]._16_8_ * dStack_1d0;
      local_100[3] = local_c0[0]._24_8_ * dStack_1c8;
      lVar11 = 0;
      do {
        local_360 = 0;
        iStack_358._M_current = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
        local_350 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[2] = local_e0[lVar11];
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * local_110;
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[1] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * dStack_108;
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[2] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * local_120;
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)&local_360,(iterator)0x0,(Matrix<double,_3,_1,_0,_3,_1> *)&local_300);
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[2] = local_100[lVar11];
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * local_130;
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[1] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * dStack_128;
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[2] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * (double)local_140._0_8_;
        if (iStack_358._M_current == local_350) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)&local_360,iStack_358,(Matrix<double,_3,_1,_0,_3,_1> *)&local_300);
        }
        else {
          ((iStack_358._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[2];
          ((iStack_358._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[0];
          ((iStack_358._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[1];
          iStack_358._M_current = iStack_358._M_current + 1;
        }
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[2] = *(double *)(local_c0[0] + lVar11 * 8);
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * local_150;
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[1] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * dStack_148;
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[2] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] * (double)local_160._0_8_;
        if (iStack_358._M_current == local_350) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)&local_360,iStack_358,(Matrix<double,_3,_1,_0,_3,_1> *)&local_300);
        }
        else {
          ((iStack_358._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[2];
          ((iStack_358._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[0];
          ((iStack_358._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[1];
          iStack_358._M_current = iStack_358._M_current + 1;
        }
        math::arun_complete(&local_300,points,(points_t *)&local_360);
        __position._M_current =
             (solutions->
             super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (solutions->
            super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                    ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                      *)solutions,__position,&local_300);
        }
        else {
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[4] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[4];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[5] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[5];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[6] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[6];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[7] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[7];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[8] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[8];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[9] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[9];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[10] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[10];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[0xb] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[0xb];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[0] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[0];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[1] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[1];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[2] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[2];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[3] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[3];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[4] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[4];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[5] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[5];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[6] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[6];
          ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[7] =
               local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[7];
          ppMVar1 = &(solutions->
                     super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        if (local_360 != 0) {
          free(*(void **)(local_360 + -8));
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      if ((undefined1 (*) [16])
          local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (undefined1 (*) [16])0x0) {
        operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::p3p_gao_main(
    const bearingVectors_t & f,
    const points_t & points,
    transformations_t & solutions )
{
  point_t A = points[0];
  point_t B = points[1];
  point_t C = points[2];

  Eigen::Vector3d tempp;
  tempp = A-B;
  double AB = tempp.norm();
  tempp = B-C;
  double BC = tempp.norm();
  tempp = A-C;
  double AC = tempp.norm();

  bearingVector_t f1 = f[0];
  bearingVector_t f2 = f[1];
  bearingVector_t f3 = f[2];

  double cosalpha = f2.transpose()*f3;
  double cosbeta = f1.transpose()*f3;
  double cosgamma = f1.transpose()*f2;

  double a=pow((BC/AB),2);
  double b=pow((AC/AB),2);
  double p=2*cosalpha;
  double q=2*cosbeta;
  double r=2*cosgamma;

  double aSq = a * a;
  double bSq = b * b;
  double pSq = p*p;
  double qSq = q*q;
  double rSq = r*r;

  if ((pSq + qSq + rSq - p*q*r - 1) == 0)
    return;

  Eigen::Matrix<double,5,1> factors;

  factors[0] = -2*b + bSq + aSq + 1 - b*rSq*a + 2*b*a - 2*a;

  if (factors[0] == 0)
    return;

  factors[1] =
      -2*b*q*a - 2*aSq*q + b*rSq*q*a - 2*q + 2*b*q +
      4*a*q + p*b*r + b*r*p*a - bSq*r*p;
  factors[2] =
      qSq + bSq*rSq - b*pSq - q*p*b*r + bSq*pSq - b*rSq*a +
      2 - 2*bSq - a*b*r*p*q + 2*aSq - 4*a - 2*qSq*a + qSq*aSq;
  factors[3] =
      -bSq*r*p + b*r*p*a - 2*aSq*q + q*pSq*b +
      2*b*q*a + 4*a*q + p*b*r - 2*b*q - 2*q;
  factors[4] = 1 - 2*a + 2*b + bSq - b*pSq + aSq - 2*b*a;

  std::vector<double> x_temp = math::o4_roots(factors);
  Eigen::Matrix<double,4,1> x;
  for( size_t i = 0; i < 4; i++ ) x[i] = x_temp[i];

  double temp = (pSq*(a-1+b) + p*q*r - q*a*r*p + (a-1-b)*rSq);
  double b0 = b * temp * temp;

  double rCb = rSq*r;

  Eigen::Matrix<double,4,1> tempXP2;
  tempXP2[0] = x[0]*x[0];
  tempXP2[1] = x[1]*x[1];
  tempXP2[2] = x[2]*x[2];
  tempXP2[3] = x[3]*x[3];
  Eigen::Matrix<double,4,1> tempXP3;
  tempXP3[0] = tempXP2[0]*x[0];
  tempXP3[1] = tempXP2[1]*x[1];
  tempXP3[2] = tempXP2[2]*x[2];
  tempXP3[3] = tempXP2[3]*x[3];

  Eigen::Matrix<double,4,1> ones;
  for( size_t i = 0; i < 4; i++) ones[i] = 1.0;

  Eigen::Matrix<double,4,1> b1_part1 =
      (1-a-b)*tempXP2 + (q*a-q)*x + (1 - a + b)*ones;

  Eigen::Matrix<double,4,1> b1_part2 =
      (aSq*rCb + 2*b*rCb*a - b*rSq*rCb*a - 2*a*rCb + rCb + bSq*rCb
      - 2*rCb*b)*tempXP3
      +(p*rSq + p*aSq*rSq - 2*b*rCb*q*a + 2*rCb*b*q - 2*rCb*q - 2*p*(a+b)*rSq
      + rSq*rSq*p*b + 4*a*rCb*q + b*q*a*rCb*rSq - 2*rCb*aSq*q +2*rSq*p*b*a
      + bSq*rSq*p - rSq*rSq*p*bSq)*tempXP2
      +(rCb*qSq + rSq*rCb*bSq + r*pSq*bSq - 4*a*rCb - 2*a*rCb*qSq + rCb*qSq*aSq
      + 2*aSq*rCb - 2*bSq*rCb - 2*pSq*b*r + 4*p*a*rSq*q + 2*a*pSq*r*b
      - 2*a*rSq*q*b*p - 2*pSq*a*r + r*pSq - b*rSq*rCb*a + 2*p*rSq*b*q
      + r*pSq*aSq -2*p*q*rSq + 2*rCb - 2*rSq*p*aSq*q - rSq*rSq*q*b*p)*x
      +(4*a*rCb*q + p*rSq*qSq + 2*pSq*p*b*a - 4*p*a*rSq - 2*rCb*b*q - 2*pSq*q*r
      - 2*bSq*rSq*p + rSq*rSq*p*b + 2*p*aSq*rSq - 2*rCb*aSq*q - 2*pSq*p*a
      + pSq*p*aSq + 2*p*rSq + pSq*p + 2*b*rCb*q*a + 2*q*pSq*b*r + 4*q*a*r*pSq
      - 2*p*a*rSq*qSq - 2*pSq*aSq*r*q + p*aSq*rSq*qSq - 2*rCb*q - 2*pSq*p*b
      + pSq*p*bSq - 2*pSq*b*r*q*a)*ones;

  Eigen::Matrix<double,4,1> b1;
  b1[0] = b1_part1[0]*b1_part2[0];
  b1[1] = b1_part1[1]*b1_part2[1];
  b1[2] = b1_part1[2]*b1_part2[2];
  b1[3] = b1_part1[3]*b1_part2[3];

  Eigen::Matrix<double,4,1> y=b1/b0;
  Eigen::Matrix<double,4,1> tempYP2;
  tempYP2[0] = pow(y[0],2);
  tempYP2[1] = pow(y[1],2);
  tempYP2[2] = pow(y[2],2);
  tempYP2[3] = pow(y[3],2);

  Eigen::Matrix<double,4,1> tempXY;
  tempXY[0] = x[0]*y[0];
  tempXY[1] = x[1]*y[1];
  tempXY[2] = x[2]*y[2];
  tempXY[3] = x[3]*y[3];

  Eigen::Matrix<double,4,1> v= tempXP2 + tempYP2 - r*tempXY;

  Eigen::Matrix<double,4,1> Z;
  Z[0] = AB/sqrt(v[0]);
  Z[1] = AB/sqrt(v[1]);
  Z[2] = AB/sqrt(v[2]);
  Z[3] = AB/sqrt(v[3]);

  Eigen::Matrix<double,4,1> X;
  X[0] = x[0]*Z[0];
  X[1] = x[1]*Z[1];
  X[2] = x[2]*Z[2];
  X[3] = x[3]*Z[3];

  Eigen::Matrix<double,4,1> Y;
  Y[0] = y[0]*Z[0];
  Y[1] = y[1]*Z[1];
  Y[2] = y[2]*Z[2];
  Y[3] = y[3]*Z[3];

  for( int i = 0; i < 4; i++ )
  {
    //apply arun to find the transformation
    points_t p_cam;
    p_cam.push_back(X[i]*f1);
    p_cam.push_back(Y[i]*f2);
    p_cam.push_back(Z[i]*f3);

    transformation_t solution = math::arun_complete(points,p_cam);
    solutions.push_back(solution);
  }
}